

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISpriteBank.cpp
# Opt level: O0

void __thiscall
irr::gui::CGUISpriteBank::draw2DSprite
          (CGUISpriteBank *this,u32 index,position2di *pos,rect<int> *clip,SColor *color,
          u32 starttime,u32 currenttime,bool loop,bool center)

{
  bool bVar1;
  u32 uVar2;
  SGUISpriteFrame *pSVar3;
  undefined8 in_RCX;
  vector2d<int> *in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  undefined4 *in_R8;
  byte in_stack_00000010;
  byte in_stack_00000018;
  position2di p;
  rect<int> *r;
  u32 rn;
  ITexture *tex;
  u32 frame;
  u32 in_stack_ffffffffffffff5c;
  array<irr::core::rect<int>_> *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  u32 uVar4;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  CGUISpriteBank *in_stack_ffffffffffffff98;
  dimension2d<int> local_60;
  vector2d<int> local_58;
  rect<int> *local_50;
  u32 local_44;
  long local_40;
  undefined4 local_34;
  byte local_2e;
  byte local_2d;
  undefined4 *local_28;
  undefined8 local_20;
  vector2d<int> *local_18;
  
  local_2d = in_stack_00000010 & 1;
  local_2e = in_stack_00000018 & 1;
  local_34 = 0;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  bVar1 = getFrameNr(in_stack_ffffffffffffff98,
                     (u32 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     (u32)((ulong)in_RDI >> 0x20),(u32)in_RDI,SUB41((uint)in_ESI >> 0x18,0));
  if (bVar1) {
    core::array<irr::gui::SGUISprite>::operator[]
              ((array<irr::gui::SGUISprite> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    pSVar3 = core::array<irr::gui::SGUISpriteFrame>::operator[]
                       ((array<irr::gui::SGUISpriteFrame> *)in_stack_ffffffffffffff60,
                        in_stack_ffffffffffffff5c);
    local_40 = (**(code **)(*in_RDI + 0x18))(in_RDI,pSVar3->textureNumber);
    if (local_40 != 0) {
      core::array<irr::gui::SGUISprite>::operator[]
                ((array<irr::gui::SGUISprite> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c)
      ;
      pSVar3 = core::array<irr::gui::SGUISpriteFrame>::operator[]
                         ((array<irr::gui::SGUISpriteFrame> *)in_stack_ffffffffffffff60,
                          in_stack_ffffffffffffff5c);
      uVar4 = pSVar3->rectNumber;
      local_44 = uVar4;
      uVar2 = core::array<irr::core::rect<int>_>::size((array<irr::core::rect<int>_> *)0x3d434c);
      if (uVar4 < uVar2) {
        local_50 = core::array<irr::core::rect<int>_>::operator[]
                             (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        local_58 = *local_18;
        if ((local_2e & 1) != 0) {
          core::rect<int>::getSize((rect<int> *)CONCAT44(uVar4,in_stack_ffffffffffffff68));
          local_60 = core::dimension2d<int>::operator/
                               ((dimension2d<int> *)CONCAT44(uVar4,in_stack_ffffffffffffff68),
                                (int *)in_stack_ffffffffffffff60);
          core::vector2d<int>::operator-=(&local_58,&local_60);
        }
        (**(code **)(*(long *)in_RDI[0xe] + 0x180))
                  ((long *)in_RDI[0xe],local_40,&local_58,local_50,local_20,*local_28,1);
      }
    }
  }
  return;
}

Assistant:

void CGUISpriteBank::draw2DSprite(u32 index, const core::position2di &pos,
		const core::rect<s32> *clip, const video::SColor &color,
		u32 starttime, u32 currenttime, bool loop, bool center)
{
	u32 frame = 0;
	if (!getFrameNr(frame, index, currenttime - starttime, loop))
		return;

	const video::ITexture *tex = getTexture(Sprites[index].Frames[frame].textureNumber);
	if (!tex)
		return;

	const u32 rn = Sprites[index].Frames[frame].rectNumber;
	if (rn >= Rectangles.size())
		return;

	const core::rect<s32> &r = Rectangles[rn];
	core::position2di p(pos);
	if (center) {
		p -= r.getSize() / 2;
	}
	Driver->draw2DImage(tex, p, r, clip, color, true);
}